

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::from_next_line(yml *this,csubstr rem)

{
  yml *pyVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  yml *pyVar5;
  size_t sVar6;
  ro_substr chars;
  csubstr cVar7;
  basic_substring<const_char> local_38;
  basic_substring<const_char> local_28;
  
  local_38.len = (size_t)rem.str;
  chars.len = 2;
  chars.str = "\r\n";
  local_38.str = (char *)this;
  pcVar4 = (char *)basic_substring<const_char>::first_of(&local_38,chars,0);
  if (pcVar4 == (char *)0xffffffffffffffff) {
    pyVar5 = (yml *)0x0;
    sVar6 = 0;
  }
  else {
    if (local_38.len <= pcVar4) {
      if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        cVar7 = (csubstr)(*pcVar2)();
        return cVar7;
      }
      handle_error(0x200e84,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    pyVar1 = (yml *)(local_38.str + (long)pcVar4);
    if (local_38.len < pcVar4) {
      if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        cVar7 = (csubstr)(*pcVar2)();
        return cVar7;
      }
      handle_error(0x200e84,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x157b,"pos <= len || pos == npos");
    }
    local_38.str = local_38.str + (long)(pcVar4 + 1);
    local_38.len = local_38.len - (long)(pcVar4 + 1);
    pyVar5 = (yml *)0x0;
    sVar6 = 0;
    if (local_38.len != 0) {
      if (((yml)*local_38.str == (yml)0xd && *pyVar1 == (yml)0xa) ||
         (pyVar5 = (yml *)local_38.str, sVar6 = local_38.len,
         (yml)*local_38.str == (yml)0xa && *pyVar1 == (yml)0xd)) {
        if (local_38.len == 0) {
          if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            cVar7 = (csubstr)(*pcVar2)();
            return cVar7;
          }
          handle_error(0x200e84,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_28,(char *)((yml *)local_38.str + 1),local_38.len - 1);
        pyVar5 = (yml *)local_28.str;
        sVar6 = local_28.len;
      }
    }
  }
  cVar7.len = sVar6;
  cVar7.str = (char *)pyVar5;
  return cVar7;
}

Assistant:

csubstr from_next_line(csubstr rem)
{
    size_t nlpos = rem.first_of("\r\n");
    if(nlpos == csubstr::npos)
        return {};
    const char nl = rem[nlpos];
    rem = rem.right_of(nlpos);
    if(rem.empty())
        return {};
    if(_extend_from_combined_newline(nl, rem.front()))
        rem = rem.sub(1);
    return rem;
}